

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

bool_t ecpFromAJ(word *b,word *a,ec_o *ec,void *stack)

{
  long lVar1;
  long in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t n;
  
  lVar1 = *(long *)(*(long *)(in_RDX + 0x18) + 0x30);
  wwCopy(in_RDI,in_RSI,*(size_t *)(*(long *)(in_RDX + 0x18) + 0x30));
  wwCopy(in_RDI + lVar1,in_RSI + lVar1,*(size_t *)(*(long *)(in_RDX + 0x18) + 0x30));
  wwCopy(in_RDI + lVar1 * 2,*(word **)(*(long *)(in_RDX + 0x18) + 0x20),
         *(size_t *)(*(long *)(in_RDX + 0x18) + 0x30));
  return 1;
}

Assistant:

static bool_t ecpFromAJ(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOnA(a, ec));
	ASSERT(a == b || wwIsDisjoint2(a, 2 * n, b, 3 * n));
	// xb <- xa
	qrCopy(ecX(b), ecX(a), ec->f);
	// yb <- ya
	qrCopy(ecY(b, n), ecY(a, n), ec->f);
	// zb <- unity
	qrSetUnity(ecZ(b, n), ec->f);
	return TRUE;
}